

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O2

size_type __thiscall
itlib::
flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
::erase<Rml::Element*>
          (flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
           *this,Element **k)

{
  Element **ppEVar1;
  iterator __position;
  
  __position = find<Rml::Element*>(this,k);
  ppEVar1 = *(Element ***)(this + 8);
  if (__position._M_current != ppEVar1) {
    std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::erase
              ((vector<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)this,
               (const_iterator)__position._M_current);
  }
  return (ulong)(__position._M_current != ppEVar1);
}

Assistant:

size_type erase(const F& k)
    {
        auto i = find(k);
        if (i == end())
        {
            return 0;
        }

        erase(i);
        return 1;
    }